

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_7zip.c
# Opt level: O0

int compression_init_encoder_ppmd(archive *a,la_zstream *lastrm,uint maxOrder,uint32_t msize)

{
  uint maxOrder_00;
  CPpmd7 *p;
  void *pvVar1;
  CPpmd7 *p_00;
  uint32_t in_ECX;
  undefined4 in_EDX;
  long in_RSI;
  archive *in_RDI;
  int r;
  uint8_t *props;
  ppmd_stream *strm;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffcc;
  int local_4;
  
  if (*(int *)(in_RSI + 0x40) != 0) {
    compression_end((archive *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
                    (la_zstream *)0x184850);
  }
  p = (CPpmd7 *)calloc(1,0x4b48);
  if (p == (CPpmd7 *)0x0) {
    archive_set_error(in_RDI,0xc,"Can\'t allocate memory for PPMd");
    local_4 = -0x1e;
  }
  else {
    pvVar1 = malloc(0x20);
    *(void **)&p[1].GlueCount = pvVar1;
    if (*(long *)&p[1].GlueCount == 0) {
      free(p);
      archive_set_error(in_RDI,0xc,"Can\'t allocate memory for PPMd");
      local_4 = -0x1e;
    }
    else {
      p[1].Base = *(Byte **)&p[1].GlueCount;
      p[1].LoUnit = (Byte *)(*(long *)&p[1].GlueCount + 0x20);
      p_00 = (CPpmd7 *)malloc(5);
      if (p_00 == (CPpmd7 *)0x0) {
        free(*(void **)&p[1].GlueCount);
        free(p);
        archive_set_error(in_RDI,0xc,"Coludn\'t allocate memory for PPMd");
        local_4 = -0x1e;
      }
      else {
        *(char *)&p_00->MinContext = (char)in_EDX;
        archive_le32enc((void *)((long)&p_00->MinContext + 1),in_ECX);
        Ppmd7_Construct((CPpmd7 *)CONCAT44(in_EDX,in_ECX));
        maxOrder_00 = Ppmd7_Alloc(p,(UInt32)((ulong)p_00 >> 0x20),
                                  (ISzAlloc *)
                                  CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
        if (maxOrder_00 == 0) {
          free(*(void **)&p[1].GlueCount);
          free(p);
          free(p_00);
          archive_set_error(in_RDI,0xc,"Coludn\'t allocate memory for PPMd");
          local_4 = -0x1e;
        }
        else {
          Ppmd7_Init(p_00,maxOrder_00);
          *(archive **)&p[1].HiBitsFlag = in_RDI;
          *(code **)&p[1].InitRL = ppmd_write;
          *(uint **)&p[1].PrevSuccess = &p[1].HiBitsFlag;
          Ppmd7z_RangeEnc_Init((CPpmd7z_RangeEnc *)&p[1].MaxContext);
          *(undefined4 *)&p->MinContext = 0;
          *(CPpmd7 **)(in_RSI + 0x48) = p;
          *(undefined4 *)(in_RSI + 0x40) = 1;
          *(code **)(in_RSI + 0x50) = compression_code_ppmd;
          *(code **)(in_RSI + 0x58) = compression_end_ppmd;
          *(undefined4 *)(in_RSI + 0x30) = 5;
          *(CPpmd7 **)(in_RSI + 0x38) = p_00;
          local_4 = 0;
        }
      }
    }
  }
  return local_4;
}

Assistant:

static int
compression_init_encoder_ppmd(struct archive *a,
    struct la_zstream *lastrm, unsigned maxOrder, uint32_t msize)
{
	struct ppmd_stream *strm;
	uint8_t *props;
	int r;

	if (lastrm->valid)
		compression_end(a, lastrm);
	strm = calloc(1, sizeof(*strm));
	if (strm == NULL) {
		archive_set_error(a, ENOMEM,
		    "Can't allocate memory for PPMd");
		return (ARCHIVE_FATAL);
	}
	strm->buff = malloc(32);
	if (strm->buff == NULL) {
		free(strm);
		archive_set_error(a, ENOMEM,
		    "Can't allocate memory for PPMd");
		return (ARCHIVE_FATAL);
	}
	strm->buff_ptr = strm->buff;
	strm->buff_end = strm->buff + 32;

	props = malloc(1+4);
	if (props == NULL) {
		free(strm->buff);
		free(strm);
		archive_set_error(a, ENOMEM,
		    "Coludn't allocate memory for PPMd");
		return (ARCHIVE_FATAL);
	}
	props[0] = maxOrder;
	archive_le32enc(props+1, msize);
	__archive_ppmd7_functions.Ppmd7_Construct(&strm->ppmd7_context);
	r = __archive_ppmd7_functions.Ppmd7_Alloc(
		&strm->ppmd7_context, msize, &g_szalloc);
	if (r == 0) {
		free(strm->buff);
		free(strm);
		free(props);
		archive_set_error(a, ENOMEM,
		    "Coludn't allocate memory for PPMd");
		return (ARCHIVE_FATAL);
	}
	__archive_ppmd7_functions.Ppmd7_Init(&(strm->ppmd7_context), maxOrder);
	strm->byteout.a = (struct archive_write *)a;
	strm->byteout.Write = ppmd_write;
	strm->range_enc.Stream = &(strm->byteout);
	__archive_ppmd7_functions.Ppmd7z_RangeEnc_Init(&(strm->range_enc));
	strm->stat = 0;

	lastrm->real_stream = strm;
	lastrm->valid = 1;
	lastrm->code = compression_code_ppmd;
	lastrm->end = compression_end_ppmd;
	lastrm->prop_size = 5;
	lastrm->props = props;
	return (ARCHIVE_OK);
}